

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  int *piVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  char cVar4;
  ftpstate instate;
  curl_usessl cVar5;
  curl_TimeCond cVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 uVar9;
  byte bVar10;
  CURLcode CVar11;
  uint uVar12;
  CURLcode CVar13;
  int iVar14;
  time_t tVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  Curl_easy *pCVar21;
  ftpport fcmd;
  curl_off_t cVar22;
  char *pcVar23;
  undefined8 *in_R8;
  byte *pbVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int year;
  undefined4 uStack_19c;
  size_t nread;
  int ftpcode;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  curl_off_t filesize;
  uint local_170;
  uint local_16c;
  int local_168;
  int local_164;
  int local_160;
  Curl_easy *local_140;
  curl_off_t size;
  undefined8 uStack_130;
  undefined8 local_128;
  
  pCVar21 = conn->data;
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar11 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar11;
  }
  CVar11 = ftp_readresp(conn->sock[0],&(pp->ftpc).pp,&ftpcode,&nread);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (ftpcode != 0xdc) {
      if (ftpcode == 0xe6) {
        CVar11 = ftp_state_loggedin(conn);
        return CVar11;
      }
      Curl_failf(pCVar21,"Got a %03d ftp-server response when 220 was expected",(ulong)(uint)ftpcode
                );
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (((pCVar21->set).use_ssl != CURLUSESSL_NONE) &&
       (((conn->ssl[0].field_0x10 & 1) == 0 ||
        (((conn->bits).proxy_ssl_connected[0] == true && ((conn->proxy_ssl[0].field_0x10 & 1) == 0))
        )))) {
      (conn->proto).ftpc.count3 = 0;
      uVar19 = (ulong)(pCVar21->set).ftpsslauth;
      if (2 < uVar19) {
        Curl_failf(pCVar21,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar14 = *(int *)(&DAT_00466fb0 + uVar19 * 4);
      lVar16 = *(long *)(&DAT_00466fc0 + uVar19 * 8);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_00466fa4 + uVar19 * 4);
      (conn->proto).ftpc.count1 = iVar14;
      CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar16);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      (conn->proto).ftpc.state = FTP_AUTH;
      return CURLE_OK;
    }
    CVar13 = ftp_state_user(conn);
    goto joined_r0x003d9148;
  case FTP_AUTH:
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      CVar11 = Curl_ssl_connect(conn,0);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      puVar2 = &(conn->bits).field_0x6;
      *puVar2 = *puVar2 & 0xf7;
    }
    else {
      iVar14 = (conn->proto).ftpc.count3;
      if (iVar14 < 1) {
        (conn->proto).ftpc.count3 = iVar14 + 1;
        lVar16 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
        (conn->proto).ftpc.count1 = (int)lVar16;
        CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"AUTH %s",ftp_statemach_act::ftpauth + lVar16);
        goto joined_r0x003d9148;
      }
      if (CURLUSESSL_TRY < (pCVar21->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
    }
    CVar13 = ftp_state_user(conn);
    goto joined_r0x003d9148;
  case FTP_USER:
  case FTP_PASS:
    pCVar21 = conn->data;
    if (ftpcode == 0x14b) {
      if (instate == FTP_USER) {
        pcVar23 = *(char **)((long)(pCVar21->req).protop + 8);
        pcVar17 = "";
        if (pcVar23 != (char *)0x0) {
          pcVar17 = pcVar23;
        }
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"PASS %s",pcVar17);
        if (CVar11 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_PASS;
          return CURLE_OK;
        }
        return CVar11;
      }
LAB_003d8aac:
      if (((pCVar21->set).str[0xb] != (char *)0x0) && (((pCVar21->state).field_0x4e4 & 0x40) == 0))
      {
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"%s");
        if (CVar11 == CURLE_OK) {
          puVar2 = &(conn->data->state).field_0x4e4;
          *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
          (conn->proto).ftpc.state = FTP_USER;
          return CURLE_OK;
        }
        return CVar11;
      }
      Curl_failf(pCVar21,"Access denied: %03d",(ulong)(uint)ftpcode);
    }
    else {
      if (ftpcode - 200U < 100) goto LAB_003d85dc;
      if (ftpcode != 0x14c) goto LAB_003d8aac;
      if ((pCVar21->set).str[10] != (char *)0x0) {
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"ACCT %s");
        if (CVar11 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_ACCT;
          return CURLE_OK;
        }
        return CVar11;
      }
      Curl_failf(pCVar21,"ACCT requested but none available");
    }
    CVar11 = CURLE_LOGIN_DENIED;
    break;
  case FTP_ACCT:
    if (ftpcode != 0xe6) {
      Curl_failf(conn->data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASS_REPLY;
    }
LAB_003d85dc:
    CVar11 = ftp_state_loggedin(conn);
    break;
  case FTP_PBSZ:
    uVar9 = 0x50;
    if ((pCVar21->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar9 = 0x43;
    }
    CVar11 = CURLE_OK;
    CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"PROT %c",uVar9);
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    (conn->proto).ftpc.state = FTP_PROT;
    break;
  case FTP_PROT:
    cVar5 = (pCVar21->set).use_ssl;
    if (ftpcode - 200U < 100) {
      *(uint *)&(conn->bits).field_0x4 =
           *(uint *)&(conn->bits).field_0x4 & 0xfff7ffff |
           (uint)(cVar5 != CURLUSESSL_CONTROL) << 0x13;
    }
    else if (CURLUSESSL_CONTROL < cVar5) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((pCVar21->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","CCC");
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      (conn->proto).ftpc.state = FTP_CCC;
      return CURLE_OK;
    }
    goto LAB_003d8b98;
  case FTP_CCC:
    if ((ftpcode < 500) && (CVar11 = Curl_ssl_shutdown(conn,0), CVar11 != CURLE_OK)) {
      Curl_failf(conn->data,"Failed to clear the command channel (CCC)");
      return CVar11;
    }
LAB_003d8b98:
    CVar13 = ftp_state_pwd(conn);
    goto joined_r0x003d9148;
  case FTP_PWD:
    if (ftpcode == 0x101) {
      pcVar23 = (pCVar21->state).buffer;
      lVar16 = (pCVar21->set).buffer_size;
      pcVar17 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar17 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      for (pcVar23 = pcVar23 + 4; cVar4 = *pcVar23, pcVar18 = pcVar17,
          pcVar23 < (pCVar21->state).buffer + lVar16; pcVar23 = pcVar23 + 1) {
        if ((cVar4 == '\0') || (cVar4 == '\n')) goto LAB_003d93b1;
        if (cVar4 == '\"') goto LAB_003d929c;
      }
      if (cVar4 == '\"') {
LAB_003d929c:
        do {
          cVar4 = pcVar23[1];
          if (cVar4 == '\"') {
            if (pcVar23[2] != '\"') {
              *pcVar18 = '\0';
              if (((conn->proto).ftpc.server_os != (char *)0x0) || (*pcVar17 == '/')) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar17;
                Curl_infof(pCVar21,"Entry path is \'%s\'\n",pcVar17);
                (pCVar21->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                goto switchD_003d828a_default;
              }
              CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SYST");
              if (CVar11 == CURLE_OK) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar17;
                Curl_infof(pCVar21,"Entry path is \'%s\'\n",pcVar17);
                (pCVar21->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                (conn->proto).ftpc.state = FTP_SYST;
                return CURLE_OK;
              }
              goto LAB_003d8e9a;
            }
            pcVar23 = pcVar23 + 2;
          }
          else {
            if (cVar4 == '\0') goto LAB_003d93ae;
            pcVar23 = pcVar23 + 1;
          }
          *pcVar18 = cVar4;
          pcVar18 = pcVar18 + 1;
        } while( true );
      }
      goto LAB_003d93b1;
    }
  default:
switchD_003d828a_default:
    (conn->proto).ftpc.state = FTP_STOP;
    CVar11 = CURLE_OK;
    break;
  case FTP_SYST:
    if (ftpcode == 0xd7) {
      pcVar23 = (pCVar21->state).buffer;
      pcVar17 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar17 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pbVar24 = (byte *)(pcVar23 + 4);
      do {
        bVar10 = *pbVar24;
        pbVar24 = pbVar24 + 1;
      } while (bVar10 == 0x20);
      lVar16 = 0;
      while ((bVar10 & 0xdf) != 0) {
        pcVar17[lVar16] = bVar10;
        pbVar3 = pbVar24 + lVar16;
        lVar16 = lVar16 + 1;
        bVar10 = *pbVar3;
      }
      pcVar17[lVar16] = '\0';
      iVar14 = Curl_strcasecompare(pcVar17,"OS/400");
      if (iVar14 != 0) {
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar11 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar17;
          (conn->proto).ftpc.state = FTP_NAMEFMT;
          return CURLE_OK;
        }
LAB_003d8e9a:
        (*Curl_cfree)(pcVar17);
        return CVar11;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar17;
    }
    goto switchD_003d828a_default;
  case FTP_NAMEFMT:
    if (ftpcode == 0xfa) {
      ftp_state_pwd(conn);
      return CURLE_OK;
    }
    goto switchD_003d828a_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((399 < ftpcode) && ((conn->proto).ftpc.count2 == 0)) {
      Curl_failf(conn->data,"QUOT command failed with %03d",(ulong)(uint)ftpcode);
      return CURLE_QUOTE_ERROR;
    }
    CVar13 = ftp_state_quote(conn,false,instate);
    goto joined_r0x003d9148;
  case FTP_CWD:
    if (99 < ftpcode - 200U) {
      if ((((conn->data->set).ftp_create_missing_dirs != 0) &&
          (lVar16 = (long)(conn->proto).ftpc.cwdcount, lVar16 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"MKD %s",
                               *(undefined8 *)(((conn->proto).pop3c.eob - 8) + lVar16 * 8));
        if (CVar11 != CURLE_OK) {
          return CVar11;
        }
        (conn->proto).ftpc.state = FTP_MKD;
        return CURLE_OK;
      }
      Curl_failf(pCVar21,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar14 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar14 + 1;
    if (iVar14 < (conn->proto).ftpc.dirdepth) {
      pcVar23 = (conn->proto).ftpc.dirs[iVar14];
      goto LAB_003d89cc;
    }
    CVar13 = ftp_state_mdtm(conn);
    goto joined_r0x003d9148;
  case FTP_MKD:
    if (99 < ftpcode - 200U) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar14 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar14 == 0) {
        Curl_failf(pCVar21,"Failed to MKD dir: %03d",(ulong)(uint)ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (conn->proto).ftpc.state = FTP_CWD;
    pcVar23 = *(char **)(((conn->proto).pop3c.eob - 8) + (long)(conn->proto).ftpc.cwdcount * 8);
LAB_003d89cc:
    CVar13 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar23);
joined_r0x003d9148:
    CVar11 = CURLE_OK;
    if (CVar13 != CURLE_OK) {
      return CVar13;
    }
    break;
  case FTP_MDTM:
    pCVar21 = conn->data;
    pvVar7 = (pCVar21->req).protop;
    if (ftpcode == 0x226) {
      bVar25 = false;
      Curl_failf(pCVar21,"Given file does not exist");
      CVar11 = CURLE_FTP_COULDNT_RETR_FILE;
    }
    else {
      if (ftpcode == 0xd5) {
        iVar14 = __isoc99_sscanf((pCVar21->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month
                                 ,&day,&hour,&minute,&second);
        if (iVar14 == 6) {
          filesize = time((time_t *)0x0);
          curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                         (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                         (ulong)(uint)second);
          tVar15 = curl_getdate((char *)&size,&filesize);
          (pCVar21->info).filetime = tVar15;
        }
        uVar12 = (uint)*(undefined8 *)&(pCVar21->set).field_0x878;
        if (((((uVar12 >> 0x1c & 1) != 0) && ((uVar12 >> 9 & 1) != 0)) &&
            ((conn->proto).ftpc.file != (char *)0x0)) &&
           (lVar16 = (pCVar21->info).filetime, -1 < lVar16)) {
          CVar11 = Curl_gmtime(lVar16,(tm *)&filesize);
          if (CVar11 != CURLE_OK) {
            return CVar11;
          }
          iVar14 = 6;
          if (local_160 != 0) {
            iVar14 = local_160 + -1;
          }
          curl_msnprintf((char *)&size,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                         Curl_wkday[iVar14],(ulong)local_16c,Curl_month[local_168],
                         (ulong)(local_164 + 0x76c),(ulong)local_170,(ulong)filesize >> 0x20,
                         filesize & 0xffffffff);
          CVar11 = Curl_client_write(conn,3,(char *)&size,0);
          if (CVar11 != CURLE_OK) {
            return CVar11;
          }
        }
      }
      else {
        Curl_infof(pCVar21,"unsupported MDTM reply format\n");
      }
      CVar11 = CURLE_OK;
      bVar25 = true;
    }
    cVar6 = (pCVar21->set).timecondition;
    if (cVar6 != CURL_TIMECOND_NONE) {
      uVar19 = (pCVar21->info).filetime;
      if (((long)uVar19 < 1) || (uVar8 = (pCVar21->set).timevalue, (long)uVar8 < 1)) {
        Curl_infof(pCVar21,"Skipping time comparison\n");
      }
      else if (cVar6 == CURL_TIMECOND_IFUNMODSINCE) {
        if (uVar8 < uVar19) {
          pcVar23 = "The requested document is not old enough\n";
LAB_003d922f:
          Curl_infof(pCVar21,pcVar23);
          *(undefined4 *)((long)pvVar7 + 0x20) = 2;
          puVar2 = &(pCVar21->info).field_0xe0;
          *puVar2 = *puVar2 | 1;
          goto switchD_003d828a_default;
        }
      }
      else if (uVar19 <= uVar8) {
        pcVar23 = "The requested document is not new enough\n";
        goto LAB_003d922f;
      }
    }
    if (bVar25) {
      CVar11 = ftp_state_type(conn);
    }
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar11 = ftp_state_type_resp(conn,ftpcode,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    pCVar21 = conn->data;
    filesize = -1;
    if (ftpcode == 0xd5) {
      curlx_strtoofft((pCVar21->state).buffer + 4,(char **)0x0,0,&filesize);
    }
    if (instate == FTP_STOR_SIZE) {
      (pCVar21->state).resume_from = filesize;
      CVar11 = ftp_state_ul_setup(conn,true);
    }
    else if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(pCVar21,filesize);
      CVar11 = ftp_state_retr(conn,filesize);
    }
    else {
      if (filesize == -1) {
        cVar22 = -1;
      }
      else {
        curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
        CVar11 = Curl_client_write(conn,3,(char *)&size,0);
        cVar22 = filesize;
        if (CVar11 != CURLE_OK) {
          return CVar11;
        }
      }
      Curl_pgrsSetDownloadSize(pCVar21,cVar22);
      CVar11 = ftp_state_rest(conn);
    }
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    if (instate == FTP_RETR_REST) {
      if (ftpcode == 0x15e) {
        CVar11 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar11 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_RETR;
          CVar11 = CURLE_OK;
        }
      }
      else {
        Curl_failf(conn->data,"Couldn\'t use REST");
        CVar11 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        CVar11 = Curl_client_write(conn,3,(char *)&size,0);
        if (CVar11 != CURLE_OK) {
          return CVar11;
        }
      }
      CVar11 = ftp_state_prepare_transfer(conn);
    }
    break;
  case FTP_PORT:
    pCVar21 = conn->data;
    if (ftpcode - 200U < 100) {
      Curl_infof(pCVar21,"Connect data stream actively\n");
      (conn->proto).ftpc.state = FTP_STOP;
      CVar11 = ftp_dophase_done(conn,false);
    }
    else {
      iVar14 = (conn->proto).ftpc.count1;
      if (iVar14 == 0) {
        Curl_infof(pCVar21,"disabling EPRT usage\n");
        puVar2 = &(conn->bits).field_0x6;
        *puVar2 = *puVar2 & 0xfb;
        fcmd = PORT;
      }
      else {
        fcmd = iVar14 + PORT;
        if (fcmd == DONE) {
          Curl_failf(pCVar21,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar11 = ftp_state_use_port(conn,fcmd);
    }
    break;
  case FTP_PRET:
    if (ftpcode != 200) {
      Curl_failf(pCVar21,"PRET command not accepted: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_PRET_FAILED;
    }
    CVar11 = ftp_state_use_pasv(conn);
    break;
  case FTP_PASV:
    pCVar21 = conn->data;
    filesize = 0;
    pcVar23 = (pCVar21->state).buffer + 4;
    (*Curl_cfree)((conn->proto).ftpc.newhost);
    (conn->proto).ftpc.newhost = (char *)0x0;
    iVar14 = (conn->proto).ftpc.count1;
    if (ftpcode == 0xe5 && iVar14 == 0) {
      pcVar23 = strchr(pcVar23,0x28);
      if ((pcVar23 == (char *)0x0) ||
         (iVar14 = __isoc99_sscanf(pcVar23 + 1,"%c%c%c%u%c",&year,(long)&year + 1,(long)&year + 2,
                                   &size,(long)&year + 3), iVar14 != 5)) {
LAB_003d8999:
        pcVar23 = "Weirdly formatted EPSV reply";
      }
      else {
        lVar16 = 1;
        do {
          if (lVar16 == 4) {
            if (0xffff < (uint)size) goto LAB_003d92d6;
            (conn->proto).ftpc.newport = (unsigned_short)(uint)size;
            if ((*(ushort *)&(conn->bits).field_0x4 & 0x4040) == 0) {
              pcVar23 = conn->ip_addr_str;
            }
            else {
              pcVar23 = (conn->host).name;
            }
            pcVar23 = (*Curl_cstrdup)(pcVar23);
            (conn->proto).ftpc.newhost = pcVar23;
            if (pcVar23 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            goto LAB_003d94b9;
          }
          pcVar23 = (char *)((long)&year + lVar16);
          lVar16 = lVar16 + 1;
        } while (*pcVar23 == (char)year);
        if ((uint)size < 0x10000) goto LAB_003d8999;
LAB_003d92d6:
        pcVar23 = "Illegal port number in EPSV reply";
      }
      Curl_failf(pCVar21,pcVar23);
    }
    else {
      if (ftpcode == 0xe3 && iVar14 == 1) {
        local_140 = pCVar21;
        for (; uVar26 = SUB84(in_R8,0), *pcVar23 != '\0'; pcVar23 = pcVar23 + 1) {
          in_R8 = &uStack_130;
          iVar14 = __isoc99_sscanf(pcVar23,"%u,%u,%u,%u,%u,%u",&size,(long)&size + 4,in_R8,
                                   (long)&uStack_130 + 4,&year,&uStack_19c);
          uVar26 = SUB84(in_R8,0);
          if (iVar14 == 6) {
            bVar25 = *pcVar23 == '\0';
            goto LAB_003d915b;
          }
        }
        bVar25 = true;
LAB_003d915b:
        pCVar21 = local_140;
        auVar27._12_4_ = uStack_19c;
        auVar27._8_4_ = year;
        auVar27._0_8_ = uStack_130;
        auVar27 = auVar27 ^ _DAT_004567c0;
        auVar28._0_4_ = -(uint)(-0x7fffff01 < auVar27._0_4_);
        auVar28._4_4_ = -(uint)(-0x7fffff01 < auVar27._4_4_);
        auVar28._8_4_ = -(uint)(-0x7fffff01 < auVar27._8_4_);
        auVar28._12_4_ = -(uint)(-0x7fffff01 < auVar27._12_4_);
        iVar14 = movmskps(uVar26,auVar28);
        if ((bool)(0xff < (uint)size | bVar25 | 0xff < size._4_4_ | iVar14 != 0)) {
          Curl_failf(local_140,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        uVar26 = (undefined4)(uStack_130 >> 0x20);
        if (((local_140->set).field_0x87a & 4) == 0) {
          pcVar23 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                  uStack_130 & 0xffffffff,uVar26);
        }
        else {
          Curl_infof(local_140,"Skip %u.%u.%u.%u for data connection, re-use %s instead\n",
                     size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,uVar26,
                     (conn->host).name);
          if ((*(ushort *)&(conn->bits).field_0x4 & 0x4040) == 0) {
            pcVar23 = conn->ip_addr_str;
          }
          else {
            pcVar23 = (conn->host).name;
          }
          pcVar23 = (*Curl_cstrdup)(pcVar23);
        }
        (conn->proto).ftpc.newhost = pcVar23;
        if (pcVar23 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->proto).ftpc.newport = (short)(year << 8) + (short)uStack_19c;
LAB_003d94b9:
        uVar12 = *(uint *)&(conn->bits).field_0x4;
        if ((uVar12 & 0x10) == 0) {
          Curl_resolv(conn,pcVar23,(uint)(conn->proto).ftpc.newport,false,
                      (Curl_dns_entry **)&filesize);
          uVar19 = (ulong)(conn->proto).ftpc.newport;
          if (filesize == 0) {
            Curl_failf(pCVar21,"Can\'t resolve new host %s:%hu",(conn->proto).ftpc.newhost,uVar19);
            return CURLE_FTP_CANT_GET_HOST;
          }
        }
        else {
          pcVar23 = (&conn->socks_proxy)[(uVar12 & 0x40) == 0].host.name;
          Curl_resolv(conn,pcVar23,(int)conn->port,false,(Curl_dns_entry **)&filesize);
          uVar19 = conn->port;
          if (filesize == 0) {
            Curl_failf(pCVar21,"Can\'t resolve proxy host %s:%hu",pcVar23,uVar19 & 0xffff);
            return CURLE_COULDNT_RESOLVE_PROXY;
          }
        }
        (conn->bits).tcpconnect[1] = false;
        CVar11 = Curl_connecthost(conn,(Curl_dns_entry *)filesize);
        if (CVar11 == CURLE_OK) {
          if (((pCVar21->set).field_0x87b & 0x40) != 0) {
            pcVar23 = (conn->proto).ftpc.newhost;
            Curl_printable_address(*(Curl_addrinfo **)filesize,(char *)&size,0x100);
            Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar23,&size,uVar19 & 0xffff);
          }
          Curl_resolv_unlock(pCVar21,(Curl_dns_entry *)filesize);
          (*Curl_cfree)(conn->secondaryhostname);
          conn->secondaryhostname = (char *)0x0;
          conn->secondary_port = (conn->proto).ftpc.newport;
          pcVar23 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
          conn->secondaryhostname = pcVar23;
          if (pcVar23 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          puVar2 = &(conn->bits).field_0x5;
          *puVar2 = *puVar2 | 8;
          (conn->proto).ftpc.state = FTP_STOP;
          return CURLE_OK;
        }
        Curl_resolv_unlock(pCVar21,(Curl_dns_entry *)filesize);
        if (ftpcode != 0xe5) {
          return CVar11;
        }
        if ((conn->proto).ftpc.count1 != 0) {
          return CVar11;
        }
LAB_003d958a:
        CVar11 = ftp_epsv_disable(conn);
        return CVar11;
      }
      if (iVar14 == 0) goto LAB_003d958a;
      Curl_failf(pCVar21,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
    }
    CVar11 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case FTP_LIST:
  case FTP_RETR:
    pCVar21 = conn->data;
    pvVar7 = (pCVar21->req).protop;
    if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
      size = -1;
      if ((instate == FTP_LIST) ||
         ((((pCVar21->set).field_0x879 & 8) != 0 || (0 < *(long *)((long)pvVar7 + 0x28))))) {
        lVar16 = *(long *)((long)pvVar7 + 0x28);
        cVar22 = lVar16;
        if (lVar16 < 0) {
LAB_003d9023:
          lVar16 = -1;
          cVar22 = size;
        }
      }
      else {
        pcVar23 = (pCVar21->state).buffer;
        pcVar17 = strstr(pcVar23," bytes");
        lVar16 = -1;
        cVar22 = size;
        if (pcVar17 != (char *)0x0) {
          pcVar23 = pcVar23 + (2 - (long)pcVar17);
          for (; (pcVar23 != (char *)0x0 && ((byte)pcVar17[-1] != 0x28)); pcVar17 = pcVar17 + -1) {
            iVar14 = Curl_isdigit((uint)(byte)pcVar17[-1]);
            if (iVar14 == 0) goto LAB_003d9023;
            pcVar23 = pcVar23 + 1;
          }
          curlx_strtoofft(pcVar17,(char **)0x0,0,&size);
          lVar16 = size;
          cVar22 = size;
        }
      }
      size = cVar22;
      lVar20 = (pCVar21->req).maxdownload;
      if (lVar20 < 1 || lVar16 <= lVar20) {
        if (instate != FTP_LIST) {
          if (((pCVar21->set).field_0x879 & 8) != 0) {
            size = -1;
          }
          goto LAB_003d9049;
        }
        pcVar23 = "Maxdownload = %ld\n";
LAB_003d9079:
        Curl_infof(pCVar21,pcVar23,lVar20);
      }
      else {
        (pCVar21->req).size = lVar20;
        size = lVar20;
LAB_003d9049:
        Curl_infof(pCVar21,"Maxdownload = %ld\n");
        if (instate != FTP_LIST) {
          pcVar23 = "Getting file with size: %ld\n";
          lVar20 = size;
          goto LAB_003d9079;
        }
      }
      (conn->proto).ftpc.state_saved = instate;
      (conn->proto).ftpc.retr_size_saved = size;
      if (((pCVar21->set).field_0x879 & 0x40) != 0) {
        CVar11 = AllowServerConnect(conn,(_Bool *)&filesize);
        if (CVar11 != CURLE_OK) {
          return CVar11;
        }
        if ((char)filesize != '\0') {
          return CURLE_OK;
        }
        Curl_infof(pCVar21,"Data conn was not available immediately\n");
        (conn->proto).ftpc.state = FTP_STOP;
LAB_003d90e4:
        (conn->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      goto LAB_003d909f;
    }
    if (ftpcode != 0x1c2 || instate != FTP_LIST) {
      Curl_failf(pCVar21,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (ftpcode == 0x226 && instate == FTP_RETR) {
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
      return CURLE_FTP_COULDNT_RETR_FILE;
    }
    *(undefined4 *)((long)pvVar7 + 0x20) = 2;
    goto switchD_003d828a_default;
  case FTP_STOR:
    pCVar21 = conn->data;
    if (399 < ftpcode) {
      Curl_failf(pCVar21,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
      (conn->proto).ftpc.state = FTP_STOP;
      return CURLE_UPLOAD_FAILED;
    }
    (conn->proto).ftpc.state_saved = FTP_STOR;
    if (((pCVar21->set).field_0x879 & 0x40) != 0) {
      (conn->proto).ftpc.state = FTP_STOP;
      CVar11 = AllowServerConnect(conn,(_Bool *)&size);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      if ((char)size != '\0') {
        return CURLE_OK;
      }
      Curl_infof(pCVar21,"Data conn was not available immediately\n");
      goto LAB_003d90e4;
    }
LAB_003d909f:
    CVar11 = InitiateTransfer(conn);
  }
  return CVar11;
LAB_003d93ae:
  *pcVar18 = '\0';
LAB_003d93b1:
  (*Curl_cfree)(pcVar17);
  Curl_infof(pCVar21,"Failed to figure out path\n");
  goto switchD_003d828a_default;
}

Assistant:

static CURLcode ftp_statemach_act(struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  result = ftp_readresp(sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(conn, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(conn))
          infof(data, "Logging in with password in cleartext!\n");
        else
          infof(data, "Authentication successful\n");
      }
#endif

      if(data->set.use_ssl &&
         (!conn->ssl[FIRSTSOCKET].use ||
          (conn->bits.proxy_ssl_connected[FIRSTSOCKET] &&
           !conn->proxy_ssl[FIRSTSOCKET].use))) {
        /* We don't have a SSL/TLS connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        PPSENDF(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        state(conn, FTP_AUTH);
      }
      else {
        result = ftp_state_user(conn);
        if(result)
          return result;
      }

      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          result = ftp_state_user(conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(conn);
      }

      if(result)
        return result;
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(conn, ftpcode);
      break;

    case FTP_PBSZ:
      PPSENDF(&ftpc->pp, "PROT %c",
              data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      state(conn, FTP_PROT);

      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        PPSENDF(&ftpc->pp, "%s", "CCC");
        state(conn, FTP_CCC);
      }
      else {
        result = ftp_state_pwd(conn);
        if(result)
          return result;
      }
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(conn, FIRSTSOCKET);

        if(result) {
          failf(conn->data, "Failed to clear the command channel (CCC)");
          return result;
        }
      }

      /* Then continue as normal */
      result = ftp_state_pwd(conn);
      if(result)
        return result;
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* zero terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {

            result = Curl_pp_sendf(&ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'\n", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(conn, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'\n", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path\n");
        }
      }
      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* zero terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(&ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(conn, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(conn);
        break;
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(conn->data, "QUOT command failed with %03d", ftpcode);
        return CURLE_QUOTE_ERROR;
      }
      result = ftp_state_quote(conn, FALSE, ftpc->state);
      if(result)
        return result;

      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(conn->data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          PPSENDF(&ftpc->pp, "MKD %s", ftpc->dirs[ftpc->cwdcount - 1]);
          state(conn, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth) {
          /* send next CWD */
          PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
        }
        else {
          result = ftp_state_mdtm(conn);
          if(result)
            return result;
        }
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      state(conn, FTP_CWD);
      /* send CWD */
      PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(conn, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(conn, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(conn, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}